

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O0

bool __thiscall ConfigReader::parse(ConfigReader *this,istream *configstream)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  string local_228;
  stringstream local_208 [8];
  stringstream ss;
  ostream local_1f8 [376];
  undefined4 local_80;
  allocator<char> local_79;
  string local_78;
  token_t local_54;
  byte local_4d;
  token_t tok;
  bool m_inComment;
  undefined1 local_40 [8];
  string tokstr;
  istream *configstream_local;
  ConfigReader *this_local;
  
  this->m_lineNum = 1;
  tokstr.field_2._8_8_ = configstream;
  uVar3 = std::ios::good();
  if ((uVar3 & 1) == 0) {
    doLog(8,"ConfigReader: input stream is not open\n");
    this_local._7_1_ = false;
  }
  else {
    this->m_is = (istream *)tokstr.field_2._8_8_;
    std::__cxx11::string::string((string *)local_40);
    cVar1 = std::istream::get();
    this->m_tokchar = cVar1;
    local_4d = 0;
    local_54 = TOK_EOF;
    do {
      local_54 = tokenize(this,(string *)local_40);
      if ((local_4d & 1) == 0) {
        if (local_54 == TOK_IDENT) {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"CORNER");
          if (bVar2) {
            bVar2 = parseCorner(this);
            if (!bVar2) {
              this_local._7_1_ = false;
              goto LAB_00164efc;
            }
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"AREA");
            if (bVar2) {
              bVar2 = parseArea(this);
              if (!bVar2) {
                this_local._7_1_ = false;
                goto LAB_00164efc;
              }
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_40,"PAD");
              if (bVar2) {
                bVar2 = parsePad(this);
                if (!bVar2) {
                  this_local._7_1_ = false;
                  goto LAB_00164efc;
                }
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_40,"GRID");
                if (bVar2) {
                  bVar2 = parseGrid(this);
                  if (!bVar2) {
                    this_local._7_1_ = false;
                    goto LAB_00164efc;
                  }
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_40,"SPACE");
                  if (bVar2) {
                    bVar2 = parseSpace(this);
                    if (!bVar2) {
                      this_local._7_1_ = false;
                      goto LAB_00164efc;
                    }
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_40,"FILLER");
                    if (bVar2) {
                      bVar2 = parseFiller(this);
                      if (!bVar2) {
                        this_local._7_1_ = false;
                        goto LAB_00164efc;
                      }
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_40,"OFFSET");
                      if (bVar2) {
                        bVar2 = parseOffset(this);
                        if (!bVar2) {
                          this_local._7_1_ = false;
                          goto LAB_00164efc;
                        }
                      }
                      else {
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_40,"DESIGN");
                        if (bVar2) {
                          bVar2 = parseDesignName(this);
                          if (!bVar2) {
                            this_local._7_1_ = false;
                            goto LAB_00164efc;
                          }
                        }
                        else {
                          std::__cxx11::stringstream::stringstream(local_208);
                          poVar4 = std::operator<<(local_1f8,"unrecognized item ");
                          poVar4 = std::operator<<(poVar4,(string *)local_40);
                          std::operator<<(poVar4,"\n");
                          std::__cxx11::stringstream::str();
                          error(this,&local_228);
                          std::__cxx11::string::~string((string *)&local_228);
                          std::__cxx11::stringstream::~stringstream(local_208);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else if (local_54 == TOK_HASH) {
          local_4d = 1;
        }
        else if (local_54 == TOK_ERR) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"Config parse error\n",&local_79);
          error(this,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::allocator<char>::~allocator(&local_79);
        }
      }
      else if (local_54 == TOK_EOL) {
        local_4d = 0;
      }
    } while (local_54 != TOK_EOF);
    this_local._7_1_ = true;
LAB_00164efc:
    local_80 = 1;
    std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool ConfigReader::parse(std::istream &configstream)
{
    m_lineNum = 1;

    if (!configstream.good())
    {
        doLog(LOG_ERROR,"ConfigReader: input stream is not open\n");
        return false;
    }

    m_is = &configstream;
    std::string tokstr;
    m_tokchar = m_is->get();

    bool m_inComment = false;
    
    ConfigReader::token_t tok = TOK_EOF;
    do
    {
        tok = tokenize(tokstr);
        if (!m_inComment)
        {   
            switch(tok)
            {
            case TOK_ERR:
                error("Config parse error\n");
                break;
            case TOK_HASH:  // line comment
                m_inComment = true;
                break;
            case TOK_IDENT:
                if (tokstr == "CORNER")
                {
                    if (!parseCorner()) return false;
                }
                else if (tokstr == "AREA")
                {
                    if (!parseArea()) return false;
                }
                else if (tokstr == "PAD")
                {
                    if (!parsePad()) return false;
                }
                else if (tokstr == "GRID")
                {
                    if (!parseGrid()) return false;
                }
                else if (tokstr == "SPACE")
                {
                    if (!parseSpace()) return false;
                }
                else if (tokstr == "FILLER")
                {
                    if (!parseFiller()) return false;
                }                
                else if (tokstr == "OFFSET")
                {
                    if (!parseOffset()) return false;
                }
                else if (tokstr == "DESIGN")
                {
                    if (!parseDesignName()) return false;
                }                
                else
                {
                    std::stringstream ss;
                    ss << "unrecognized item " << tokstr << "\n";
                    error(ss.str());
                }
                break;
            default:
                ;
            }
        }
        else
        {
            if (tok == TOK_EOL)
            {
                m_inComment = false;
            }
        }
    } while(tok != TOK_EOF);

    return true;
}